

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

void __thiscall
re2c::OutputFile::emit
          (OutputFile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *types,size_t max_fill)

{
  OutputBlock *pOVar1;
  OutputFragment *this_00;
  bool bVar2;
  uint32_t uVar3;
  pointer ppOVar4;
  pointer ppOVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  string content;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  ulong local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  size_t local_38;
  
  if ((this->file != (FILE *)0x0) &&
     (ppOVar4 = (this->blocks).
                super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     (this->blocks).super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
     _M_impl.super__Vector_impl_data._M_finish != ppOVar4)) {
    local_48 = 0;
    iVar7 = 1;
    local_40 = types;
    local_38 = max_fill;
    do {
      pOVar1 = ppOVar4[local_48];
      ppOVar5 = (pOVar1->fragments).
                super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pOVar1->fragments).
          super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppOVar5) {
        uVar6 = 0;
        uVar8 = 1;
        do {
          this_00 = ppOVar5[uVar6];
          switch(this_00->type) {
          case LINE_INFO:
            output_line_info((ostream *)&this_00->stream,iVar7 + 1,this->file_name);
            break;
          case STATE_GOTO:
            output_state_goto((ostream *)&this_00->stream,this_00->indent,0);
            break;
          case TYPES:
            output_types((ostream *)&this_00->stream,this_00->indent,local_40);
            break;
          case WARN_CONDITION_ORDER:
            if (this->warn_condition_order == true) {
              Warn::condition_order((Warn *)warn,pOVar1->line);
            }
            break;
          case YYACCEPT_INIT:
            output_yyaccept_init((ostream *)&this_00->stream,this_00->indent,pOVar1->used_yyaccept);
            break;
          case YYMAXFILL:
            output_yymaxfill((ostream *)&this_00->stream,local_38);
          }
          std::__cxx11::stringbuf::str();
          fwrite(local_68,1,local_60,(FILE *)this->file);
          uVar3 = OutputFragment::count_lines(this_00);
          if (local_68 != local_58) {
            operator_delete(local_68,local_58[0] + 1);
          }
          iVar7 = uVar3 + iVar7;
          ppOVar5 = (pOVar1->fragments).
                    super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar2 = uVar8 < (ulong)((long)(pOVar1->fragments).
                                        super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar5
                                 >> 3);
          uVar6 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar2);
      }
      local_48 = (ulong)((int)local_48 + 1);
      ppOVar4 = (this->blocks).
                super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (local_48 <
             (ulong)((long)(this->blocks).
                           super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar4 >> 3));
  }
  return;
}

Assistant:

void OutputFile::emit
	( const std::vector<std::string> & types
	, size_t max_fill
	)
{
	if (file != NULL)
	{
		unsigned int line_count = 1;
		for (unsigned int j = 0; j < blocks.size (); ++j)
		{
			OutputBlock & b = * blocks[j];
			for (unsigned int i = 0; i < b.fragments.size (); ++i)
			{
				OutputFragment & f = * b.fragments[i];
				switch (f.type)
				{
					case OutputFragment::CODE:
						break;
					case OutputFragment::LINE_INFO:
						output_line_info (f.stream, line_count + 1, file_name);
						break;
					case OutputFragment::STATE_GOTO:
						output_state_goto (f.stream, f.indent, 0);
						break;
					case OutputFragment::TYPES:
						output_types (f.stream, f.indent, types);
						break;
					case OutputFragment::WARN_CONDITION_ORDER:
						if (warn_condition_order) // see note [condition order]
						{
							warn.condition_order (b.line);
						}
						break;
					case OutputFragment::YYACCEPT_INIT:
						output_yyaccept_init (f.stream, f.indent, b.used_yyaccept);
						break;
					case OutputFragment::YYMAXFILL:
						output_yymaxfill (f.stream, max_fill);
						break;
				}
				std::string content = f.stream.str ();
				fwrite (content.c_str (), 1, content.size (), file);
				line_count += f.count_lines ();
			}
		}
	}
}